

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O1

value * __thiscall mjs::value::operator=(value *this,value *rhs)

{
  gc_heap *pgVar1;
  wostream *pwVar2;
  char *pcVar3;
  wostringstream _woss;
  wstring_view local_1a0;
  wostringstream local_190 [376];
  
  if (this != rhs) {
    destroy(this);
    switch(rhs->type_) {
    case undefined:
    case null:
      break;
    case boolean:
      (this->field_1).b_ = (rhs->field_1).b_;
      break;
    case number:
      (this->field_1).n_ = (rhs->field_1).n_;
      break;
    case string:
    case object:
      pgVar1 = (rhs->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
      (this->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = pgVar1;
      *(undefined4 *)((long)&this->field_1 + 8) = *(undefined4 *)((long)&rhs->field_1 + 8);
      if (pgVar1 != (gc_heap *)0x0) {
        gc_heap::attach(pgVar1,(gc_heap_ptr_untyped *)&(this->field_1).s_);
      }
      break;
    case reference:
      pgVar1 = (rhs->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_;
      (this->field_1).s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.heap_ = pgVar1;
      *(undefined4 *)((long)&this->field_1 + 8) = *(undefined4 *)((long)&rhs->field_1 + 8);
      if (pgVar1 != (gc_heap *)0x0) {
        gc_heap::attach(pgVar1,(gc_heap_ptr_untyped *)&(this->field_1).s_);
      }
      pgVar1 = (rhs->field_1).r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.
               super_gc_heap_ptr_untyped.heap_;
      (this->field_1).r_.property_name_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
      heap_ = pgVar1;
      *(undefined4 *)((long)&this->field_1 + 0x18) = *(undefined4 *)((long)&rhs->field_1 + 0x18);
      if (pgVar1 != (gc_heap *)0x0) {
        gc_heap::attach(pgVar1,(gc_heap_ptr_untyped *)&(this->field_1).r_.property_name_);
      }
      break;
    default:
      std::__cxx11::wostringstream::wostringstream(local_190);
      pwVar2 = std::operator<<((wostream *)local_190,"Not implemented: ");
      pcVar3 = string_value(rhs->type_);
      std::operator<<(pwVar2,pcVar3);
      std::__cxx11::wstringbuf::str();
      throw_runtime_error(&local_1a0,
                          "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/value.cpp"
                          ,0x33);
    }
    this->type_ = rhs->type_;
  }
  return this;
}

Assistant:

value& value::operator=(const value& rhs) {
    if (this != &rhs) {
        destroy();
        switch (rhs.type_) {
        case value_type::undefined: break;
        case value_type::null:      break;
        case value_type::boolean:   b_ = rhs.b_; break;
        case value_type::number:    n_ = rhs.n_; break;
        case value_type::string:    new (&s_) string{rhs.s_}; break;
        case value_type::object:    new (&o_) object_ptr{rhs.o_}; break;
        case value_type::reference: new (&r_) reference{rhs.r_}; break;
        default: NOT_IMPLEMENTED(rhs.type_);
        }
        type_ = rhs.type_;
    }
    return *this;
}